

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameworkIntegrations.cpp
# Opt level: O2

void ApprovalTests::FrameworkIntegrations::setTestPassedNotification
               (TestPassedNotification *notification)

{
  function<void_()> fStack_28;
  
  ::std::function<void_()>::function(&fStack_28,notification);
  FileApprover::setTestPassedNotification(&fStack_28);
  ::std::_Function_base::~_Function_base(&fStack_28.super__Function_base);
  return;
}

Assistant:

void FrameworkIntegrations::setTestPassedNotification(
        FileApprover::TestPassedNotification notification)
    {
        FileApprover::setTestPassedNotification(notification);
    }